

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int ARKodeSetJacEvalFrequency(void *arkode_mem,long msbj)

{
  int iVar1;
  ARKLsMem in_RAX;
  long lVar2;
  int error_code;
  char *msgfmt;
  ARKLsMem arkls_mem;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x2f1;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x110) != 0) {
      arkls_mem = in_RAX;
      iVar1 = arkLs_AccessLMem((ARKodeMem)arkode_mem,"ARKodeSetJacEvalFrequency",&arkls_mem);
      if (iVar1 != 0) {
        return iVar1;
      }
      lVar2 = 0x33;
      if (0 < msbj) {
        lVar2 = msbj;
      }
      arkls_mem->msbj = lVar2;
      return 0;
    }
    msgfmt = "time-stepping module does not require an algebraic solver";
    error_code = -0x30;
    iVar1 = 0x2fa;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetJacEvalFrequency",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_ls.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeSetJacEvalFrequency(void* arkode_mem, long int msbj)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* store input and return */
  arkls_mem->msbj = (msbj <= ZERO) ? ARKLS_MSBJ : msbj;

  return (ARKLS_SUCCESS);
}